

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.hpp
# Opt level: O0

value websocketpp::processor::error::to_ws(error_code ec)

{
  bool bVar1;
  int iVar2;
  error_category *this;
  error_category *__other;
  error_code local_18;
  
  this = std::error_code::category(&local_18);
  __other = get_processor_category();
  bVar1 = std::_V2::error_category::operator!=(this,__other);
  if (bVar1) {
    return 0;
  }
  iVar2 = std::error_code::value(&local_18);
  if (iVar2 != 3) {
    if (iVar2 == 4) {
      return 0x3f1;
    }
    if (iVar2 == 5) {
      return 0x3ef;
    }
    if (6 < iVar2 - 7U) {
      if (iVar2 == 0x10) {
        return 0x3ef;
      }
      if (iVar2 != 0x18 && iVar2 != 0x19) {
        return 0x3f3;
      }
    }
  }
  return 0x3ea;
}

Assistant:

inline close::status::value to_ws(lib::error_code ec) {
    if (ec.category() != get_processor_category()) {
        return close::status::blank;
    }

    switch (ec.value()) {
        case error::protocol_violation:
        case error::control_too_big:
        case error::invalid_opcode:
        case error::invalid_rsv_bit:
        case error::fragmented_control:
        case error::invalid_continuation:
        case error::masking_required:
        case error::masking_forbidden:
        case error::reserved_close_code:
        case error::invalid_close_code:
            return close::status::protocol_error;
        case error::invalid_payload:
        case error::invalid_utf8:
            return close::status::invalid_payload;
        case error::message_too_big:
            return close::status::message_too_big;
        default:
            return close::status::internal_endpoint_error;
    }
}